

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O3

void __thiscall
cppcms::impl::details::
basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::check(basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        *this)

{
  pointer ppVar1;
  size_type sVar2;
  container *pcVar3;
  container *pcVar4;
  container *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ostream *poVar8;
  runtime_error *prVar9;
  size_t sVar10;
  size_type sVar11;
  long lVar12;
  size_t sVar13;
  container *pcVar14;
  ulong uVar15;
  ostringstream oss;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  pcVar14 = (this->list_).begin;
  if (pcVar14 == (container *)0x0) {
    sVar10 = 0;
  }
  else {
    ppVar1 = (this->hash_).
             super__Vector_base<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>,_std::allocator<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar10 = 0;
    do {
      sVar2 = (pcVar14->val).first._M_string_length;
      if (sVar2 == 0) {
        uVar6 = 0;
      }
      else {
        sVar11 = 0;
        uVar6 = 0;
        do {
          uVar6 = uVar6 + (long)(pcVar14->val).first._M_dataplus._M_p[sVar11] * 0xac + 0xd;
          sVar11 = sVar11 + 1;
        } while (sVar2 != sVar11);
      }
      uVar6 = uVar6 % (ulong)((long)(this->hash_).
                                    super__Vector_base<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>,_std::allocator<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4);
      pcVar3 = ppVar1[uVar6].first;
      pcVar4 = ppVar1[uVar6].second;
      pcVar5 = pcVar3;
      if (pcVar3 != pcVar14 && pcVar3 == pcVar4) {
        std::__cxx11::ostringstream::ostringstream(local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
                   ,0x5b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x116);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," r.first==p",0xb);
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar9,local_1c0);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      for (; pcVar5 != pcVar4; pcVar5 = pcVar5->next) {
        if (pcVar5 == pcVar14) goto LAB_00108198;
        pcVar3 = pcVar4;
      }
      if (pcVar3 != pcVar14) {
        std::__cxx11::ostringstream::ostringstream(local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
                   ,0x5b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x121);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," p2 == p",8);
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar9,local_1c0);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
LAB_00108198:
      pcVar3 = pcVar14->next;
      if ((pcVar3 == (container *)0x0) && (pcVar14 != (this->list_).end)) {
        std::__cxx11::ostringstream::ostringstream(local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
                   ,0x5b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x123);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," p == list_.end",0xf);
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar9,local_1c0);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      sVar10 = sVar10 + 1;
      pcVar14 = pcVar3;
    } while (pcVar3 != (container *)0x0);
  }
  if (this->size_ != sVar10) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
               ,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x126);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," size_ == count",0xf);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,local_1c0);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppVar1 = (this->hash_).
           super__Vector_base<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>,_std::allocator<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar12 = (long)(this->hash_).
                 super__Vector_base<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>,_std::allocator<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1;
  if (lVar12 == 0) {
    sVar13 = 0;
  }
  else {
    uVar6 = lVar12 >> 4;
    uVar15 = 0;
    sVar13 = 0;
    do {
      for (pcVar14 = ppVar1[uVar15].first; pcVar14 != (container *)0x0;
          pcVar14 = *(container **)((long)pcVar14 + 0x30)) {
        sVar2 = *(size_type *)&((value_type *)((long)pcVar14 + 8))->first;
        if (sVar2 == 0) {
          uVar7 = 0;
        }
        else {
          sVar11 = 0;
          uVar7 = 0;
          do {
            uVar7 = uVar7 + (long)*(char *)(*(long *)pcVar14 + sVar11) * 0xac + 0xd;
            sVar11 = sVar11 + 1;
          } while (sVar2 != sVar11);
        }
        if (uVar7 % uVar6 != uVar15) {
          std::__cxx11::ostringstream::ostringstream(local_1a0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
                     ,0x5b);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,300);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," h(p->val.first) % hash_.size() == i",0x24);
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar9,local_1c0);
          __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        sVar13 = sVar13 + 1;
        if (pcVar14 == ppVar1[uVar15].second) break;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar6 + (uVar6 == 0));
  }
  if (sVar10 == sVar13) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
             ,0x5b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x131);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," size_ == count",0xf);
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar9,local_1c0);
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check()
	{
		size_t count = 0;
		for(iterator p=list_.begin;p!=0;p=p->next,count++) {
			range_type &r = get(p->val.first);
			if(r.first == r.second) {
				TEST(r.first==p);
			}
			bool found = false;
			iterator p2;
			for(p2=r.first;p2!=r.second;p2=p2->next) {
				if(p2 == p) {
					found = true;
					break;
				}
			}
			if(!found)
				TEST(p2 == p);
			if(p->next == 0) {
				TEST(p == list_.end);
			}
		}
		TEST(size_ == count);
		count = 0;
		for(size_t i=0;i<hash_.size();i++) {
			for(iterator p=hash_[i].first;p;p=p->next) {
				count++;
				Hash h;
				TEST(h(p->val.first) % hash_.size() == i);
				if(p==hash_[i].second)
					break;
			}
		}
		TEST(size_ == count);
	}